

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::BasicCopyTexSubImage2DCase::createTexture(BasicCopyTexSubImage2DCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  int format;
  byte bVar3;
  int i;
  int iVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  Context *pCVar9;
  long lVar10;
  NotSupportedError *this_01;
  int i_2;
  int iVar11;
  bool bVar12;
  int ndx;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ChannelOrder CVar17;
  uint uVar18;
  float fVar19;
  deUint32 tex;
  Vec4 colorA;
  Vec4 colorB;
  PixelBufferAccess local_208;
  Random rnd;
  TextureFormat fmt;
  float afStack_1c0 [4];
  TextureLevel data;
  GradientShader shader;
  
  iVar4 = (*((this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  lVar10 = CONCAT44(extraout_var,iVar4);
  bVar12 = false;
  if ((0 < *(int *)(lVar10 + 8)) && (0 < *(int *)(lVar10 + 0xc))) {
    bVar12 = 0 < *(int *)(lVar10 + 0x10);
  }
  iVar4 = *(int *)(lVar10 + 0x14);
  fmt = glu::mapGLTransferFormat
                  (*(deUint32 *)&(this->super_Texture2DSpecCase).field_0xd4,this->m_dataType);
  CVar17 = fmt.order;
  bVar3 = (byte)fmt.order;
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&fmt);
  dVar5 = deStringHash((this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar5);
  FboTestUtil::GradientShader::GradientShader(&shader,TYPE_FLOAT_VEC4);
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
  dVar5 = (*pCVar9->_vptr_Context[0x75])(pCVar9,&shader);
  if ((CVar17 == A || bVar12) &&
     ((RGBA < CVar17 || (0xedU >> (bVar3 & 0x1f) & 1) != 0) || 0 < iVar4)) {
    sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
    sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
    if (0 < (this->super_Texture2DSpecCase).m_numLevels) {
      iVar4 = 0;
      do {
        iVar14 = (this->super_Texture2DSpecCase).m_height >> ((byte)iVar4 & 0x1f);
        local_208.super_ConstPixelBufferAccess.m_format.order = R;
        local_208.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
        local_208.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
        local_208.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
        iVar11 = (this->super_Texture2DSpecCase).m_width >> ((byte)iVar4 & 0x1f);
        if (iVar11 < 2) {
          iVar11 = 1;
        }
        lVar10 = 0;
        do {
          colorB.m_data[lVar10] = 1.0;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        if (iVar14 < 2) {
          iVar14 = 1;
        }
        colorA.m_data[0] = 0.0;
        colorA.m_data[1] = 0.0;
        colorA.m_data[2] = 0.0;
        colorA.m_data[3] = 0.0;
        lVar10 = 0;
        do {
          fVar1 = (float)local_208.super_ConstPixelBufferAccess.m_size.m_data[lVar10 + -2];
          fVar2 = colorB.m_data[lVar10];
          fVar19 = deRandom_getFloat(&rnd.m_rnd);
          colorA.m_data[lVar10] = (fVar2 - fVar1) * fVar19 + fVar1;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        local_208.super_ConstPixelBufferAccess.m_format.order = R;
        local_208.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
        local_208.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
        local_208.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
        lVar10 = 0;
        do {
          afStack_1c0[lVar10] = 1.0;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        colorB.m_data[0] = 0.0;
        colorB.m_data[1] = 0.0;
        colorB.m_data[2] = 0.0;
        colorB.m_data[3] = 0.0;
        lVar10 = 0;
        do {
          fVar1 = (float)local_208.super_ConstPixelBufferAccess.m_size.m_data[lVar10 + -2];
          fVar2 = afStack_1c0[lVar10];
          fVar19 = deRandom_getFloat(&rnd.m_rnd);
          colorB.m_data[lVar10] = (fVar2 - fVar1) * fVar19 + fVar1;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        dVar6 = deRandom_getUint32(&rnd.m_rnd);
        tcu::TextureLevel::setSize(&data,iVar11,iVar14,1);
        tcu::TextureLevel::getAccess(&local_208,&data);
        tcu::fillWithGrid(&local_208,dVar6 % 0xf + 2,&colorA,&colorB);
        format = *(int *)&(this->super_Texture2DSpecCase).field_0xd4;
        dVar6 = this->m_dataType;
        tcu::TextureLevel::getAccess(&local_208,&data);
        sglr::ContextWrapper::glTexImage2D
                  (this_00,0xde1,iVar4,format,iVar11,iVar14,0,format,dVar6,
                   local_208.super_ConstPixelBufferAccess.m_data);
        iVar4 = iVar4 + 1;
      } while (iVar4 < (this->super_Texture2DSpecCase).m_numLevels);
    }
    pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_208.super_ConstPixelBufferAccess.m_format.order = R;
    local_208.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    local_208.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    local_208.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    lVar10 = 0;
    do {
      colorA.m_data[lVar10] = 1.0;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    FboTestUtil::GradientShader::setGradient(&shader,pCVar9,dVar5,(Vec4 *)&local_208,&colorA);
    pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_208.super_ConstPixelBufferAccess.m_format.order = 0xbf800000;
    local_208.super_ConstPixelBufferAccess.m_format.type = 0xbf800000;
    local_208.super_ConstPixelBufferAccess.m_size.m_data._0_8_ =
         local_208.super_ConstPixelBufferAccess.m_size.m_data._0_8_ & 0xffffffff00000000;
    colorA.m_data._0_8_ = &DAT_3f8000003f800000;
    colorA.m_data._8_8_ = colorA.m_data._8_8_ & 0xffffffff00000000;
    sglr::drawQuad(pCVar9,dVar5,(Vec3 *)&local_208,(Vec3 *)&colorA);
    if (0 < (this->super_Texture2DSpecCase).m_numLevels) {
      iVar4 = 0;
      do {
        uVar18 = (this->super_Texture2DSpecCase).m_width >> ((byte)iVar4 & 0x1f);
        if ((int)uVar18 < 2) {
          uVar18 = 1;
        }
        uVar13 = (this->super_Texture2DSpecCase).m_height >> ((byte)iVar4 & 0x1f);
        if ((int)uVar13 < 2) {
          uVar13 = 1;
        }
        dVar5 = deRandom_getUint32(&rnd.m_rnd);
        uVar15 = dVar5 % uVar18;
        dVar5 = deRandom_getUint32(&rnd.m_rnd);
        uVar16 = dVar5 % uVar13;
        dVar5 = deRandom_getUint32(&rnd.m_rnd);
        dVar6 = deRandom_getUint32(&rnd.m_rnd);
        iVar11 = sglr::ContextWrapper::getWidth(this_00);
        dVar7 = deRandom_getUint32(&rnd.m_rnd);
        iVar14 = sglr::ContextWrapper::getHeight(this_00);
        dVar8 = deRandom_getUint32(&rnd.m_rnd);
        sglr::ContextWrapper::glCopyTexSubImage2D
                  (this_00,0xde1,iVar4,dVar5 % (uVar18 - uVar15),dVar6 % (uVar13 - uVar16),
                   dVar7 % (iVar11 - uVar15),dVar8 % (iVar14 - uVar16),uVar15 + 1,uVar16 + 1);
        iVar4 = iVar4 + 1;
      } while (iVar4 < (this->super_Texture2DSpecCase).m_numLevels);
    }
    sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
    tcu::TextureLevel::~TextureLevel(&data);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Copying from current framebuffer is not supported",
             glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
             ,0x7c4);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= glu::mapGLTransferFormat(m_format, m_dataType);
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		deUint32					tex				= 0;
		tcu::TextureLevel			data			(fmt);
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader			(glu::TYPE_FLOAT_VEC4);
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// First specify full texture.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			Vec4	colorA		= randomVector<4>(rnd);
			Vec4	colorB		= randomVector<4>(rnd);
			int		cellSize	= rnd.getInt(2, 16);

			data.setSize(levelW, levelH);
			tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_format, levelW, levelH, 0, m_format, m_dataType, data.getAccess().getDataPtr());
		}

		// Fill render target with gradient.
		shader.setGradient(*getCurrentContext(), shaderID, Vec4(0.0f), Vec4(1.0f));
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		// Re-specify parts of each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			int		w			= rnd.getInt(1, levelW);
			int		h			= rnd.getInt(1, levelH);
			int		xo			= rnd.getInt(0, levelW-w);
			int		yo			= rnd.getInt(0, levelH-h);

			int		x			= rnd.getInt(0, getWidth() - w);
			int		y			= rnd.getInt(0, getHeight() - h);

			glCopyTexSubImage2D(GL_TEXTURE_2D, ndx, xo, yo, x, y, w, h);
		}
	}